

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O0

QVariant * __thiscall QMYSQLResult::handle(QMYSQLResult *this)

{
  QMYSQLResultPrivate *value;
  QVariant *in_RDI;
  QMYSQLResultPrivate *d;
  
  value = d_func((QMYSQLResult *)0x10a8c8);
  if ((value->preparedQuery & 1U) == 0) {
    QVariant::fromValue<MYSQL_RES*>((MYSQL_RES **)value);
  }
  else if (value->meta == (MYSQL_RES *)0x0) {
    QVariant::fromValue<MYSQL_STMT*>((MYSQL_STMT **)value);
  }
  else {
    QVariant::fromValue<MYSQL_RES*>((MYSQL_RES **)value);
  }
  return in_RDI;
}

Assistant:

QVariant QMYSQLResult::handle() const
{
    Q_D(const QMYSQLResult);
    if (d->preparedQuery)
        return d->meta ? QVariant::fromValue(d->meta) : QVariant::fromValue(d->stmt);
    else
        return QVariant::fromValue(d->result);
}